

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O2

istream * jaegertracing::net::http::readLineCRLF(istream *in,string *line)

{
  long *plVar1;
  char ch;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  while (plVar1 = (long *)std::istream::get((char *)in),
        (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::push_back((char)line);
  }
  return in;
}

Assistant:

inline std::istream& readLineCRLF(std::istream& in, std::string& line)
{
    line.clear();
    auto ch = '\0';
    auto sawCR = false;
    while (in.get(ch)) {
        if (sawCR) {
            if (ch == '\n') {
                break;
            }
            else {
                line.push_back('\r');
                line.push_back(ch);
                sawCR = false;
            }
        }
        else {
            if (ch == '\r') {
                sawCR = true;
            }
            else {
                line.push_back(ch);
            }
        }
    }

    return in;
}